

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Patterns.cpp
# Opt level: O3

bool slang::ast::StructurePattern::createVars
               (ASTContext *context,StructurePatternSyntax *syntax,Type *targetType,
               SmallVector<const_slang::ast::PatternVarSymbol_*,_5UL> *results)

{
  PatternSyntax *syntax_00;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar1;
  SyntaxNode *syntax_01;
  bool bVar2;
  bool bVar3;
  Scope *this;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar4;
  specific_symbol_iterator<slang::ast::FieldSymbol> sVar5;
  Type *pTVar6;
  Diagnostic *pDVar7;
  Symbol *pSVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
  sVar12;
  SourceRange SVar13;
  string_view name;
  
  bVar2 = Type::isStruct(targetType);
  if ((bVar2) && ((syntax->members).elements._M_extent._M_extent_value != 0)) {
    pTVar6 = targetType->canonical;
    if (pTVar6 == (Type *)0x0) {
      Type::resolveCanonical(targetType);
      pTVar6 = targetType->canonical;
    }
    this = Symbol::scopeOrNull(&pTVar6->super_Symbol);
    ppSVar4 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                         (syntax->members).elements._M_ptr);
    if ((*ppSVar4)->kind != OrderedStructurePatternMember) {
      uVar9 = (syntax->members).elements._M_extent._M_extent_value + 1;
      if (uVar9 < 2) {
        return true;
      }
      uVar9 = uVar9 >> 1;
      bVar2 = true;
      lVar11 = 0;
      do {
        ppSVar4 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                            ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                             ((long)&(((syntax->members).elements._M_ptr)->super_ConstTokenOrSyntax)
                                     .
                                     super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                             + lVar11));
        pSVar1 = *ppSVar4;
        name = parsing::Token::valueText((Token *)(pSVar1 + 1));
        pSVar8 = Scope::find(this,name);
        if (pSVar8 == (Symbol *)0x0) {
          if (name._M_len != 0) {
            SVar13 = parsing::Token::range((Token *)(pSVar1 + 1));
            pDVar7 = ASTContext::addDiag(context,(DiagCode)0x3a000a,SVar13);
            pDVar7 = Diagnostic::operator<<(pDVar7,name);
            ast::operator<<(pDVar7,targetType);
          }
          Pattern::createPlaceholderVars(context,(PatternSyntax *)pSVar1[2].parent,results);
          bVar2 = false;
        }
        else {
          syntax_01 = pSVar1[2].parent;
          pTVar6 = DeclaredType::getType((DeclaredType *)(pSVar8 + 1));
          bVar3 = Pattern::createPatternVars(context,(PatternSyntax *)syntax_01,pTVar6,results);
          bVar2 = bVar2 != false && bVar3;
        }
        lVar11 = lVar11 + 0x30;
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
      return bVar2;
    }
    sVar12 = Scope::membersOfType<slang::ast::FieldSymbol>(this);
    sVar5 = sVar12._M_begin.current;
    uVar9 = (syntax->members).elements._M_extent._M_extent_value + 1;
    bVar2 = true;
    if (1 < uVar9) {
      bVar2 = true;
      uVar10 = 0;
      do {
        ppSVar4 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                            ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                             ((syntax->members).elements._M_ptr + uVar10 * 2));
        syntax_00 = *(PatternSyntax **)(*ppSVar4 + 1);
        if (sVar5.current == sVar12._M_end.current.current) {
          if (bVar2 != false) {
            SVar13 = slang::syntax::SyntaxNode::sourceRange(*ppSVar4);
            pDVar7 = ASTContext::addDiag(context,(DiagCode)0x860007,SVar13);
            ast::operator<<(pDVar7,targetType);
            bVar2 = false;
          }
          Pattern::createPlaceholderVars(context,syntax_00,results);
        }
        else {
          pTVar6 = DeclaredType::getType((DeclaredType *)(sVar5.current + 1));
          bVar3 = Pattern::createPatternVars(context,syntax_00,pTVar6,results);
          bVar2 = (bool)(bVar3 & bVar2);
          do {
            sVar5.current = (sVar5.current)->nextInScope;
            if (sVar5.current == (Symbol *)0x0) {
              sVar5.current = (Symbol *)0x0;
              break;
            }
          } while ((sVar5.current)->kind != Field);
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != uVar9 >> 1);
    }
    if (sVar5.current == sVar12._M_end.current.current) {
      return bVar2;
    }
    SVar13 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    pDVar7 = ASTContext::addDiag(context,(DiagCode)0x850007,SVar13);
    ast::operator<<(pDVar7,targetType);
  }
  else {
    pTVar6 = targetType->canonical;
    if (pTVar6 == (Type *)0x0) {
      Type::resolveCanonical(targetType);
      pTVar6 = targetType->canonical;
    }
    if (((pTVar6->super_Symbol).kind != ErrorType) &&
       ((syntax->members).elements._M_extent._M_extent_value != 0)) {
      SVar13 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      pDVar7 = ASTContext::addDiag(context,(DiagCode)0x870007,SVar13);
      ast::operator<<(pDVar7,targetType);
    }
    Pattern::createPlaceholderVars(context,&syntax->super_PatternSyntax,results);
  }
  return false;
}

Assistant:

bool StructurePattern::createVars(const ASTContext& context,
                                  const syntax::StructurePatternSyntax& syntax,
                                  const Type& targetType,
                                  SmallVector<const PatternVarSymbol*>& results) {
    if (!targetType.isStruct() || syntax.members.empty()) {
        if (!targetType.isError() && !syntax.members.empty())
            context.addDiag(diag::PatternStructType, syntax.sourceRange()) << targetType;

        createPlaceholderVars(context, syntax, results);
        return false;
    }

    bool result = true;
    auto& structScope = targetType.getCanonicalType().as<Scope>();

    if (syntax.members[0]->kind == SyntaxKind::OrderedStructurePatternMember) {
        auto fields = structScope.membersOfType<FieldSymbol>();
        auto it = fields.begin();
        for (auto memberSyntax : syntax.members) {
            auto& patternSyntax = *memberSyntax->as<OrderedStructurePatternMemberSyntax>().pattern;
            if (it == fields.end()) {
                if (result) {
                    context.addDiag(diag::PatternStructTooMany, memberSyntax->sourceRange())
                        << targetType;
                    result = false;
                }

                createPlaceholderVars(context, patternSyntax, results);
                continue;
            }

            result &= createPatternVars(context, patternSyntax, it->getType(), results);
            it++;
        }

        if (it != fields.end()) {
            context.addDiag(diag::PatternStructTooFew, syntax.sourceRange()) << targetType;
            result = false;
        }
    }
    else {
        for (auto memberSyntax : syntax.members) {
            auto& nspms = memberSyntax->as<NamedStructurePatternMemberSyntax>();
            auto memberName = nspms.name.valueText();
            auto member = structScope.find(memberName);
            if (!member) {
                if (!memberName.empty()) {
                    auto& diag = context.addDiag(diag::UnknownMember, nspms.name.range());
                    diag << memberName << targetType;
                }

                createPlaceholderVars(context, *nspms.pattern, results);
                result = false;
                continue;
            }

            auto& field = member->as<FieldSymbol>();
            result &= createPatternVars(context, *nspms.pattern, field.getType(), results);
        }
    }

    return result;
}